

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O1

void __thiscall
mjs::test_spec_runner::test_spec_runner
          (test_spec_runner *this,gc_heap *h,
          vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *specs,block_statement *statements
          )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  version ver;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  this->specs_ = specs;
  (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (statements->super_statement).super_syntax_node.extend_.file.
       super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (statements->super_statement).super_syntax_node.extend_.file.
           super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  ver = tested_version();
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(const_mjs::statement_&,_const_mjs::completion_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp:177:35)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_mjs::statement_&,_const_mjs::completion_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp:177:35)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  interpreter::interpreter(&this->i_,h,ver,(on_statement_executed_type *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  this->index_ = 0;
  this->last_line_ = 0;
  completion::completion(&this->last_result_,(value *)&value::undefined,normal);
  return;
}

Assistant:

explicit test_spec_runner(gc_heap& h, const std::vector<test_spec>& specs, const block_statement& statements)
        : specs_(specs)
        , source_(statements.extend().file)
        , i_(h, tested_version(), [this](const statement& s, const completion& res) {
#ifdef TEST_SPEC_DEBUG
            std::wcout << pos_w << s.extend().start << "-" << pos_w << s.extend().end << ": ";
            print(std::wcout, s);
            std::wcout << " ==> " << debug_string(res.result) << "\n";
#endif
            if (s.extend().file == source_ && s.extend().start > last_line_) {
                check_test_spec_done(s.extend().start);
                last_result_ = res;
                last_line_ = s.extend().start;
            }
#if 0 // The stress test should be enabled, but this might still be relevant later on when debugging the GC
            h.garbage_collect(); // Run garbage collection after each statement to help catch bugs
#endif
        })
#ifdef TEST_SPEC_DEBUG
        , heap_(h)
#endif
    {
    }